

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestCommentBefore::runTestCase(TestValueTestCommentBefore *this)

{
  long in_RDI;
  string exp2_2;
  string res2_2;
  string result_2;
  char expected_2 [8];
  string exp2_1;
  string res2_1;
  string result_1;
  char expected_1 [45];
  Value other;
  string exp2;
  string res2;
  string result;
  char expected [42];
  StreamWriterBuilder wbuilder;
  Value val;
  Value *in_stack_fffffffffffffaf8;
  Value *in_stack_fffffffffffffb00;
  uint line;
  StreamWriterBuilder *this_00;
  Value *in_stack_fffffffffffffb08;
  allocator *file;
  StreamWriterBuilder *in_stack_fffffffffffffb10;
  string *actual;
  string *in_stack_fffffffffffffb18;
  string *expected_00;
  TestResult *in_stack_fffffffffffffb20;
  TestResult *result_00;
  Value *in_stack_fffffffffffffb30;
  Value *this_01;
  string local_470 [8];
  Value *in_stack_fffffffffffffb98;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [39];
  undefined1 local_3c1 [33];
  string local_3a0 [32];
  char local_380 [32];
  Value *in_stack_fffffffffffffca0;
  Factory *in_stack_fffffffffffffca8;
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  string local_238 [32];
  char local_218 [96];
  string local_1b8 [32];
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  char local_c8 [200];
  
  Json::Value::Value((Value *)in_stack_fffffffffffffb10,
                     (ValueType)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  Json::Value::setComment
            ((Value *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (CommentPlacement)((ulong)in_stack_fffffffffffffb00 >> 0x20));
  Json::StreamWriterBuilder::StreamWriterBuilder(in_stack_fffffffffffffb10);
  Json::Value::Value((Value *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  Json::Value::operator[]((Value *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  Json::Value::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  Json::Value::~Value(in_stack_fffffffffffffb30);
  builtin_strncpy(local_c8 + 0x20,"fore\nnull",10);
  builtin_strncpy(local_c8 + 0x10,"should appear be",0x10);
  builtin_strncpy(local_c8,"// this comment ",0x10);
  Json::writeString_abi_cxx11_(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,local_c8,&local_109);
  std::__cxx11::string::string(local_130,local_e8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10
             ,(char *)in_stack_fffffffffffffb08,(uint)((ulong)in_stack_fffffffffffffb00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  Json::Value::toStyledString_abi_cxx11_(in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"\n",&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::operator+=(local_170,local_c8);
  std::__cxx11::string::operator+=(local_170,"\n");
  std::__cxx11::string::string(local_198,local_170);
  std::__cxx11::string::string(local_1b8,local_150);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10
             ,(char *)in_stack_fffffffffffffb08,(uint)((ulong)in_stack_fffffffffffffb00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_e8);
  Json::Value::Value((Value *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  Json::Value::swapPayload((Value *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  builtin_strncpy(local_218 + 0x20,"fore\n\"hello\"",0xd);
  builtin_strncpy(local_218 + 0x10,"should appear be",0x10);
  builtin_strncpy(local_218,"// this comment ",0x10);
  Json::writeString_abi_cxx11_(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,local_218,&local_259);
  std::__cxx11::string::string(local_280,local_238);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10
             ,(char *)in_stack_fffffffffffffb08,(uint)((ulong)in_stack_fffffffffffffb00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  Json::Value::toStyledString_abi_cxx11_(in_stack_fffffffffffffb98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"\n",&local_2c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::operator+=(local_2c0,local_218);
  std::__cxx11::string::operator+=(local_2c0,"\n");
  this_01 = *(Value **)(in_RDI + 8);
  std::__cxx11::string::string(local_2e8,local_2c0);
  std::__cxx11::string::string(local_308,local_2a0);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10
             ,(char *)in_stack_fffffffffffffb08,(uint)((ulong)in_stack_fffffffffffffb00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  result_00 = *(TestResult **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"null\n",&local_329);
  Json::Value::toStyledString_abi_cxx11_(in_stack_fffffffffffffb98);
  JsonTest::checkStringEqual
            (result_00,in_stack_fffffffffffffb18,(string *)in_stack_fffffffffffffb10,
             (char *)in_stack_fffffffffffffb08,(uint)((ulong)in_stack_fffffffffffffb00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_238);
  Json::Value::Value((Value *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  Json::Value::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  line = (uint)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  Json::Value::~Value(this_01);
  builtin_strncpy(local_380,"\"hello\"",8);
  Json::writeString_abi_cxx11_(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  actual = *(string **)(in_RDI + 8);
  expected_00 = (string *)local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3c1 + 1),local_380,(allocator *)expected_00);
  std::__cxx11::string::string(local_3e8,local_3a0);
  JsonTest::checkStringEqual
            (result_00,expected_00,actual,(char *)in_stack_fffffffffffffb08,line,
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string((string *)(local_3c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3c1);
  Json::Value::toStyledString_abi_cxx11_(in_stack_fffffffffffffb98);
  file = &local_429;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"",file);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::operator+=(local_428,local_380);
  std::__cxx11::string::operator+=(local_428,"\n");
  this_00 = *(StreamWriterBuilder **)(in_RDI + 8);
  std::__cxx11::string::string(local_450,local_428);
  std::__cxx11::string::string(local_470,local_408);
  JsonTest::checkStringEqual
            (result_00,expected_00,actual,(char *)file,(uint)((ulong)this_00 >> 0x20),
             (char *)in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_3a0);
  Json::Value::~Value(this_01);
  Json::StreamWriterBuilder::~StreamWriterBuilder(this_00);
  Json::Value::~Value(this_01);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, CommentBefore) {
  Json::Value val; // fill val
  val.setComment("// this comment should appear before", Json::commentBefore);
  Json::StreamWriterBuilder wbuilder;
  wbuilder.settings_["commentStyle"] = "All";
  {
    char const expected[] = "// this comment should appear before\nnull";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
  Json::Value other = "hello";
  val.swapPayload(other);
  {
    char const expected[] = "// this comment should appear before\n\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
    JSONTEST_ASSERT_STRING_EQUAL("null\n", other.toStyledString());
  }
  val = "hello";
  // val.setComment("// this comment should appear before", Json::CommentPlacement::commentBefore);
  // Assignment over-writes comments.
  {
    char const expected[] = "\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
}